

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O0

void __thiscall EventQueue::Flush(EventQueue *this)

{
  Event *this_00;
  bool bVar1;
  Event **ppEVar2;
  Event *temp;
  undefined1 local_28 [8];
  AutoLock _auto_lock_;
  EventQueue *this_local;
  
  _auto_lock_._16_8_ = this;
  AutoLock::AutoLock((AutoLock *)local_28,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0xb4);
  while( true ) {
    bVar1 = JetHead::list<Event_*>::empty(&this->mQueue);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = JetHead::list<Event_*>::front(&this->mQueue);
    this_00 = *ppEVar2;
    JetHead::list<Event_*>::pop_front(&this->mQueue);
    RefCount::Release(&this_00->super_RefCount);
  }
  AutoLock::~AutoLock((AutoLock *)local_28);
  return;
}

Assistant:

void EventQueue::Flush()
{
	DebugAutoLock( mLock );

	// Scan through all events, remove them from the queue and
	// release a reference from them.
	while (not mQueue.empty())
	{
		Event* temp = mQueue.front();
		mQueue.pop_front();
		temp->Release();
	}
}